

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTiming.c
# Opt level: O0

void find_composite_order
               (IceTDouble *projection,IceTDouble *modelview,region_divide region_divisions)

{
  int iVar1;
  int plane_side;
  int my_side;
  int axis;
  region_divide current_divide;
  int plane_orientations [3];
  IceTInt my_position;
  IceTInt *process_ranks;
  int num_proc;
  region_divide region_divisions_local;
  IceTDouble *modelview_local;
  IceTDouble *projection_local;
  
  iVar1 = icetCommSize();
  get_axis_plane_orientations(projection,modelview,(int *)&current_divide);
  plane_orientations[1] = 0;
  for (_my_side = region_divisions; _my_side != (region_divide)0x0; _my_side = _my_side->next) {
    if (((_my_side->my_side < 0) && (plane_orientations[(long)_my_side->axis + -2] < 0)) ||
       ((0 < _my_side->my_side && (0 < plane_orientations[(long)_my_side->axis + -2])))) {
      plane_orientations[1] = _my_side->num_other_side + plane_orientations[1];
    }
  }
  register0x00000000 = (IceTInt *)malloc((long)iVar1 << 2);
  icetCommAllgather(plane_orientations + 1,1,0x8003,register0x00000000);
  icetEnable(0x142);
  icetCompositeOrder(stack0xffffffffffffffd0);
  free(stack0xffffffffffffffd0);
  return;
}

Assistant:

static void find_composite_order(const IceTDouble *projection,
                                 const IceTDouble *modelview,
                                 region_divide region_divisions)
{
    int num_proc = icetCommSize();
    IceTInt *process_ranks;
    IceTInt my_position;
    int plane_orientations[3];
    region_divide current_divide;

    get_axis_plane_orientations(projection, modelview, plane_orientations);

    my_position = 0;
    for (current_divide = region_divisions;
         current_divide != NULL;
         current_divide = current_divide->next) {
        int axis = current_divide->axis;
        int my_side = current_divide->my_side;
        int plane_side = plane_orientations[axis];
        /* If my_side is the side of the plane away from the camera, add
           everything on the other side as before me. */
        if (   ((my_side < 0) && (plane_side < 0))
            || ((0 < my_side) && (0 < plane_side)) ) {
            my_position += current_divide->num_other_side;
        }
    }

    process_ranks = malloc(num_proc * sizeof(IceTInt));
    icetCommAllgather(&my_position, 1, ICET_INT, process_ranks);

    icetEnable(ICET_ORDERED_COMPOSITE);
    icetCompositeOrder(process_ranks);

    free(process_ranks);
}